

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O2

VoxWriter *
vox::VoxWriter::Create
          (string *vFilePathName,uint32_t *vLimitX,uint32_t *vLimitY,uint32_t *vLimitZ,
          int32_t *vError)

{
  int32_t iVar1;
  VoxWriter *this;
  int32_t *vError_00;
  ulong local_60;
  ulong local_58;
  string local_50;
  
  this = (VoxWriter *)operator_new(0x1a0);
  local_50._M_dataplus._M_p = (pointer)(ulong)*vLimitX;
  local_58 = (ulong)*vLimitY;
  local_60 = (ulong)*vLimitZ;
  VoxWriter(this,(VoxelX *)&local_50,&local_58,&local_60);
  iVar1 = IsOk(this,vFilePathName);
  *vError = iVar1;
  if (iVar1 != 0) {
    GetErrnoMsg_abi_cxx11_(&local_50,(VoxWriter *)vError,vError_00);
    printf("Vox file creation failed, err : %s",local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    ~VoxWriter(this);
    operator_delete(this);
    this = (VoxWriter *)0x0;
  }
  return this;
}

Assistant:

VoxWriter* VoxWriter::Create(const std::string& vFilePathName, const uint32_t& vLimitX, const uint32_t& vLimitY, const uint32_t& vLimitZ, int32_t* vError) {
    VoxWriter* vox = new VoxWriter(vLimitX, vLimitY, vLimitZ);

    *vError = vox->IsOk(vFilePathName);

    if (*vError == 0) {
        return vox;
    } else {
        printf("Vox file creation failed, err : %s", GetErrnoMsg(*vError).c_str());

        SAFE_DELETE(vox);
    }

    return vox;
}